

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O0

void switch_graphics(nh_text_mode mode)

{
  nh_text_mode mode_local;
  
  if ((mode == ASCII_GRAPHICS) || (mode != UNICODE_GRAPHICS)) {
    cur_drawing = default_drawing;
  }
  else if (ui_flags.unicode == '\0') {
    cur_drawing = default_drawing;
  }
  else {
    cur_drawing = unicode_drawing;
  }
  nh_box_set_graphics(mode);
  return;
}

Assistant:

void switch_graphics(enum nh_text_mode mode)
{
    switch (mode) {
	default:
	case ASCII_GRAPHICS:
	    cur_drawing = default_drawing;
	    break;

/*
 * Drawing with the full unicode charset. Naturally this requires a unicode terminal.
 */
	case UNICODE_GRAPHICS:
	    if (ui_flags.unicode)
		cur_drawing = unicode_drawing;
	    else
		cur_drawing = default_drawing;
	    break;
    }

    /* Set box drawing characters. */
    nh_box_set_graphics(mode);
}